

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_buffer_send(dynbuf *in,connectdata *conn,curl_off_t *bytes_written,
                         size_t included_body_bytes,int socketindex)

{
  curl_socket_t sockfd_00;
  Curl_easy *data_00;
  void *pvVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t size_00;
  long lVar4;
  char *pcVar5;
  size_t local_a0;
  size_t local_98;
  size_t bodylen;
  size_t headlen;
  size_t headersize;
  size_t sStack_70;
  curl_socket_t sockfd;
  size_t sendsize;
  HTTP *http;
  Curl_easy *data;
  size_t size;
  char *ptr;
  ulong uStack_40;
  CURLcode result;
  ssize_t amount;
  size_t sStack_30;
  int socketindex_local;
  size_t included_body_bytes_local;
  curl_off_t *bytes_written_local;
  connectdata *conn_local;
  dynbuf *in_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  sockfd_00 = conn->sock[socketindex];
  amount._4_4_ = socketindex;
  sStack_30 = included_body_bytes;
  included_body_bytes_local = (size_t)bytes_written;
  bytes_written_local = (curl_off_t *)conn;
  conn_local = (connectdata *)in;
  size = (size_t)Curl_dyn_ptr(in);
  sVar3 = Curl_dyn_len((dynbuf *)conn_local);
  local_a0 = sVar3 - sStack_30;
  sStack_70 = sVar3;
  if ((((*(uint *)(bytes_written_local[0xd0] + 0x88) & 1) != 0) ||
      ((int)bytes_written_local[0x7d] == 2)) && ((int)bytes_written_local[0x94] != 0x14)) {
    local_98 = sVar3;
    if (0x3fff < sVar3) {
      local_98 = 0x4000;
    }
    sStack_70 = local_98;
    CVar2 = Curl_get_upload_buffer(data_00);
    if (CVar2 != CURLE_OK) {
      Curl_dyn_free((dynbuf *)conn_local);
      return CVar2;
    }
    memcpy((data_00->state).ulbuf,(void *)size,local_98);
    size = (size_t)(data_00->state).ulbuf;
  }
  CVar2 = Curl_write((connectdata *)bytes_written_local,sockfd_00,(void *)size,sStack_70,
                     (ssize_t *)&stack0xffffffffffffffc0);
  if (CVar2 == CURLE_OK) {
    if (uStack_40 <= local_a0) {
      local_a0 = uStack_40;
    }
    size_00 = uStack_40 - local_a0;
    if (((*(ulong *)&(data_00->set).field_0x978 >> 0x1e & 1) != 0) &&
       (Curl_debug(data_00,CURLINFO_HEADER_OUT,(char *)size,local_a0), size_00 != 0)) {
      Curl_debug(data_00,CURLINFO_DATA_OUT,(char *)(size + local_a0),size_00);
    }
    *(ulong *)included_body_bytes_local = uStack_40 + *(long *)included_body_bytes_local;
    if (pvVar1 == (void *)0x0) {
      if (uStack_40 != sVar3) {
        return CURLE_SEND_ERROR;
      }
    }
    else {
      (data_00->req).writebytecount = size_00 + (data_00->req).writebytecount;
      Curl_pgrsSetUploadCounter(data_00,(data_00->req).writebytecount);
      if (uStack_40 != sVar3) {
        lVar4 = sVar3 - uStack_40;
        pcVar5 = Curl_dyn_ptr((dynbuf *)conn_local);
        *(curl_read_callback *)((long)pvVar1 + 0x1f0) = (data_00->state).fread_func;
        *(void **)((long)pvVar1 + 0x1f8) = (data_00->state).in;
        *(undefined8 *)((long)pvVar1 + 0x200) = *(undefined8 *)((long)pvVar1 + 0x10);
        *(undefined8 *)((long)pvVar1 + 0x208) = *(undefined8 *)((long)pvVar1 + 8);
        (data_00->state).fread_func = readmoredata;
        (data_00->state).in = bytes_written_local;
        *(char **)((long)pvVar1 + 0x10) = pcVar5 + uStack_40;
        *(long *)((long)pvVar1 + 8) = lVar4;
        *(Curl_easy **)((long)pvVar1 + 0x218) = conn_local->data;
        *(undefined8 *)((long)pvVar1 + 0x220) = *(undefined8 *)&conn_local->cnnct;
        *(undefined8 *)((long)pvVar1 + 0x228) = *(undefined8 *)((conn_local->cnnct).socksreq + 4);
        *(undefined8 *)((long)pvVar1 + 0x230) = *(undefined8 *)((conn_local->cnnct).socksreq + 0xc);
        *(undefined4 *)((long)pvVar1 + 0x210) = 1;
        return CURLE_OK;
      }
      *(undefined4 *)((long)pvVar1 + 0x210) = 2;
    }
  }
  Curl_dyn_free((dynbuf *)conn_local);
  return CVar2;
}

Assistant:

CURLcode Curl_buffer_send(struct dynbuf *in,
                          struct connectdata *conn,
                          /* add the number of sent bytes to this
                             counter */
                          curl_off_t *bytes_written,
                          /* how much of the buffer contains body data */
                          size_t included_body_bytes,
                          int socketindex)
{
  ssize_t amount;
  CURLcode result;
  char *ptr;
  size_t size;
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
  size_t sendsize;
  curl_socket_t sockfd;
  size_t headersize;

  DEBUGASSERT(socketindex <= SECONDARYSOCKET);

  sockfd = conn->sock[socketindex];

  /* The looping below is required since we use non-blocking sockets, but due
     to the circumstances we will just loop and try again and again etc */

  ptr = Curl_dyn_ptr(in);
  size = Curl_dyn_len(in);

  headersize = size - included_body_bytes; /* the initial part that isn't body
                                              is header */

  DEBUGASSERT(size > included_body_bytes);

  result = Curl_convert_to_network(data, ptr, headersize);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result) {
    /* conversion failed, free memory and return to the caller */
    Curl_dyn_free(in);
    return result;
  }

  if((conn->handler->flags & PROTOPT_SSL
#ifndef CURL_DISABLE_PROXY
      || conn->http_proxy.proxytype == CURLPROXY_HTTPS
#endif
       )
     && conn->httpversion != 20) {
    /* We never send more than CURL_MAX_WRITE_SIZE bytes in one single chunk
       when we speak HTTPS, as if only a fraction of it is sent now, this data
       needs to fit into the normal read-callback buffer later on and that
       buffer is using this size.
    */

    sendsize = CURLMIN(size, CURL_MAX_WRITE_SIZE);

    /* OpenSSL is very picky and we must send the SAME buffer pointer to the
       library when we attempt to re-send this buffer. Sending the same data
       is not enough, we must use the exact same address. For this reason, we
       must copy the data to the uploadbuffer first, since that is the buffer
       we will be using if this send is retried later.
    */
    result = Curl_get_upload_buffer(data);
    if(result) {
      /* malloc failed, free memory and return to the caller */
      Curl_dyn_free(in);
      return result;
    }
    memcpy(data->state.ulbuf, ptr, sendsize);
    ptr = data->state.ulbuf;
  }
  else {
#ifdef CURLDEBUG
    /* Allow debug builds override this logic to force short initial sends */
    char *p = getenv("CURL_SMALLREQSEND");
    if(p) {
      size_t altsize = (size_t)strtoul(p, NULL, 10);
      if(altsize)
        sendsize = CURLMIN(size, altsize);
      else
        sendsize = size;
    }
    else
#endif
    sendsize = size;
  }

  result = Curl_write(conn, sockfd, ptr, sendsize, &amount);

  if(!result) {
    /*
     * Note that we may not send the entire chunk at once, and we have a set
     * number of data bytes at the end of the big buffer (out of which we may
     * only send away a part).
     */
    /* how much of the header that was sent */
    size_t headlen = (size_t)amount>headersize ? headersize : (size_t)amount;
    size_t bodylen = amount - headlen;

    if(data->set.verbose) {
      /* this data _may_ contain binary stuff */
      Curl_debug(data, CURLINFO_HEADER_OUT, ptr, headlen);
      if(bodylen) {
        /* there was body data sent beyond the initial header part, pass that
           on to the debug callback too */
        Curl_debug(data, CURLINFO_DATA_OUT,
                   ptr + headlen, bodylen);
      }
    }

    /* 'amount' can never be a very large value here so typecasting it so a
       signed 31 bit value should not cause problems even if ssize_t is
       64bit */
    *bytes_written += (long)amount;

    if(http) {
      /* if we sent a piece of the body here, up the byte counter for it
         accordingly */
      data->req.writebytecount += bodylen;
      Curl_pgrsSetUploadCounter(data, data->req.writebytecount);

      if((size_t)amount != size) {
        /* The whole request could not be sent in one system call. We must
           queue it up and send it later when we get the chance. We must not
           loop here and wait until it might work again. */

        size -= amount;

        ptr = Curl_dyn_ptr(in) + amount;

        /* backup the currently set pointers */
        http->backup.fread_func = data->state.fread_func;
        http->backup.fread_in = data->state.in;
        http->backup.postdata = http->postdata;
        http->backup.postsize = http->postsize;

        /* set the new pointers for the request-sending */
        data->state.fread_func = (curl_read_callback)readmoredata;
        data->state.in = (void *)conn;
        http->postdata = ptr;
        http->postsize = (curl_off_t)size;

        http->send_buffer = *in; /* copy the whole struct */
        http->sending = HTTPSEND_REQUEST;

        return CURLE_OK;
      }
      http->sending = HTTPSEND_BODY;
      /* the full buffer was sent, clean up and return */
    }
    else {
      if((size_t)amount != size)
        /* We have no continue-send mechanism now, fail. This can only happen
           when this function is used from the CONNECT sending function. We
           currently (stupidly) assume that the whole request is always sent
           away in the first single chunk.

           This needs FIXing.
        */
        return CURLE_SEND_ERROR;
    }
  }
  Curl_dyn_free(in);

  return result;
}